

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

float_t dja::determinant(mat4 *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  fVar1 = m->m[1].y;
  fVar2 = m->m[1].x;
  fVar3 = m->m[0].x;
  fVar4 = m->m[0].y;
  fVar5 = m->m[1].z;
  fVar6 = m->m[0].z;
  fVar7 = m->m[1].w;
  fVar8 = m->m[0].w;
  fVar9 = m->m[2].z;
  fVar10 = m->m[3].w;
  fVar11 = m->m[3].z;
  fVar12 = m->m[2].w;
  fVar13 = m->m[2].y;
  fVar14 = m->m[3].y;
  fVar15 = m->m[2].x;
  fVar16 = m->m[3].x;
  return (fVar15 * fVar14 - fVar13 * fVar16) * (fVar6 * fVar7 - fVar8 * fVar5) +
         (((fVar10 * fVar15 - fVar12 * fVar16) * (fVar4 * fVar5 - fVar6 * fVar1) +
          (fVar13 * fVar11 - fVar9 * fVar14) * (fVar3 * fVar7 - fVar2 * fVar8) +
          ((fVar9 * fVar10 - fVar12 * fVar11) * (fVar3 * fVar1 - fVar4 * fVar2) -
          (fVar13 * fVar10 - fVar12 * fVar14) * (fVar3 * fVar5 - fVar6 * fVar2))) -
         (fVar11 * fVar15 - fVar9 * fVar16) * (fVar4 * fVar7 - fVar1 * fVar8));
}

Assistant:

float_t determinant(const mat4& m)
{
    const float_t s0 = M00(m) * M11(m) - M10(m) * M01(m);
    const float_t s1 = M00(m) * M12(m) - M10(m) * M02(m);
    const float_t s2 = M00(m) * M13(m) - M10(m) * M03(m);
    const float_t s3 = M01(m) * M12(m) - M11(m) * M02(m);
    const float_t s4 = M01(m) * M13(m) - M11(m) * M03(m);
    const float_t s5 = M02(m) * M13(m) - M12(m) * M03(m);
    const float_t c5 = M22(m) * M33(m) - M32(m) * M23(m);
    const float_t c4 = M21(m) * M33(m) - M31(m) * M23(m);
    const float_t c3 = M21(m) * M32(m) - M31(m) * M22(m);
    const float_t c2 = M20(m) * M33(m) - M30(m) * M23(m);
    const float_t c1 = M20(m) * M32(m) - M30(m) * M22(m);
    const float_t c0 = M20(m) * M31(m) - M30(m) * M21(m);
    const float_t det = s0 * c5 - s1 * c4 + s2 * c3
                      + s3 * c2 - s4 * c1 + s5 * c0;

    return det;
}